

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O3

void hexdump(char *title,uint8_t *p,size_t l)

{
  long lVar1;
  
  fprintf(_stderr,"%s (%zu bytes):\n",title,l);
  if (l == 0) {
    return;
  }
  do {
    fputs("   ",_stderr);
    lVar1 = 0;
    do {
      fprintf(_stderr," %02x",(ulong)p[lVar1]);
      if (l - 1 == lVar1) {
        fputc(10,_stderr);
        return;
      }
      lVar1 = lVar1 + 1;
    } while ((int)lVar1 != 0x10);
    fputc(10,_stderr);
    l = l - lVar1;
    p = p + lVar1;
  } while( true );
}

Assistant:

static void hexdump(const char *title, const uint8_t *p, size_t l)
{
    fprintf(stderr, "%s (%zu bytes):\n", title, l);

    while (l != 0) {
        int i;
        fputs("   ", stderr);
        for (i = 0; i < 16; ++i) {
            fprintf(stderr, " %02x", *p++);
            if (--l == 0)
                break;
        }
        fputc('\n', stderr);
    }
}